

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O3

int qtree_decode(uchar *infile,int *a,int n,int nqx,int nqy,int nbitplanes)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uchar *a_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int nx;
  int iVar8;
  int ny;
  char *err_message;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  
  iVar5 = nqy;
  if (nqy < nqx) {
    iVar5 = nqx;
  }
  dVar13 = log((double)iVar5);
  iVar8 = (int)(dVar13 / 0.6931471805599453 + 0.5);
  bVar1 = 1 << ((byte)iVar8 & 0x1f) < iVar5;
  iVar11 = (nqx - (nqx + 1 >> 0x1f)) + 1 >> 1;
  iVar5 = (nqy - (nqy + 1 >> 0x1f)) + 1 >> 1;
  a_00 = (uchar *)malloc((long)iVar5 * (long)iVar11);
  if (a_00 == (uchar *)0x0) {
    err_message = "qtree_decode: insufficient memory";
LAB_001c11ad:
    ffpmsg(err_message);
    iVar5 = 0x19e;
  }
  else {
    if (0 < nbitplanes) {
      iVar6 = (uint)bVar1 + iVar8;
      do {
        if (bits_to_go < 4) {
          buffer2 = buffer2 << 8 | (uint)infile[nextchar];
          nextchar = nextchar + 1;
          bits_to_go = bits_to_go + 8;
        }
        bits_to_go = bits_to_go + -4;
        uVar3 = buffer2 >> ((byte)bits_to_go & 0x1f) & 0xf;
        if (uVar3 == 0xf) {
          iVar4 = input_huffman(infile);
          *a_00 = (uchar)iVar4;
          if (1 < iVar6) {
            ny = 1;
            nx = 1;
            iVar4 = (uint)bVar1 + iVar8 + -1;
            iVar10 = 1 << ((byte)iVar6 & 0x1f);
            iVar12 = nqy;
            iVar9 = nqx;
            do {
              iVar10 = iVar10 >> 1;
              iVar7 = iVar10;
              if (iVar9 <= iVar10) {
                iVar7 = 0;
              }
              nx = nx * 2 - (uint)(iVar9 <= iVar10);
              iVar9 = iVar9 - iVar7;
              iVar7 = iVar10;
              if (iVar12 <= iVar10) {
                iVar7 = 0;
              }
              ny = ny * 2 - (uint)(iVar12 <= iVar10);
              iVar12 = iVar12 - iVar7;
              qtree_expand(infile,a_00,nx,ny,a_00);
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
        }
        else {
          if (uVar3 != 0) {
            err_message = "qtree_decode: bad format code";
            goto LAB_001c11ad;
          }
          input_nnybble(infile,iVar5 * iVar11,a_00);
        }
        qtree_bitins(a_00,nqx,nqy,a,n,nbitplanes + -1);
        bVar2 = 1 < nbitplanes;
        nbitplanes = nbitplanes + -1;
      } while (bVar2);
    }
    free(a_00);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
qtree_decode(unsigned char *infile, int a[], int n, int nqx, int nqy, int nbitplanes)

/*
char *infile;
int a[];				 a is 2-D array with dimensions (n,n)	
int n;					 length of full row in a				
int nqx;				 partial length of row to decode		
int nqy;				 partial length of column (<=n)		
int nbitplanes;				 number of bitplanes to decode		
*/
{
int log2n, k, bit, b, nqmax;
int nx,ny,nfx,nfy,c;
int nqx2, nqy2;
unsigned char *scratch;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * allocate scratch array for working space
	 */
	nqx2=(nqx+1)/2;
	nqy2=(nqy+1)/2;
	scratch = (unsigned char *) malloc((size_t)nqx2*nqy2);
	if (scratch == (unsigned char *) NULL) {
		ffpmsg("qtree_decode: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * now decode each bit plane, starting at the top
	 * A is assumed to be initialized to zero
	 */
	for (bit = nbitplanes-1; bit >= 0; bit--) {
		/*
		 * Was bitplane was quadtree-coded or written directly?
		 */
		b = input_nybble(infile);

		if(b == 0) {
			/*
			 * bit map was written directly
			 */
			read_bdirect(infile,a,n,nqx,nqy,scratch,bit);
		} else if (b != 0xf) {
			ffpmsg("qtree_decode: bad format code");
			return(DATA_DECOMPRESSION_ERR);
		} else {
			/*
			 * bitmap was quadtree-coded, do log2n expansions
			 *
			 * read first code
			 */
			scratch[0] = input_huffman(infile);
			/*
			 * now do log2n expansions, reading codes from file as necessary
			 */
			nx = 1;
			ny = 1;
			nfx = nqx;
			nfy = nqy;
			c = 1<<log2n;
			for (k = 1; k<log2n; k++) {
				/*
				 * this somewhat cryptic code generates the sequence
				 * n[k-1] = (n[k]+1)/2 where n[log2n]=nqx or nqy
				 */
				c = c>>1;
				nx = nx<<1;
				ny = ny<<1;
				if (nfx <= c) { nx -= 1; } else { nfx -= c; }
				if (nfy <= c) { ny -= 1; } else { nfy -= c; }
				qtree_expand(infile,scratch,nx,ny,scratch);
			}
			/*
			 * now copy last set of 4-bit codes to bitplane bit of array a
			 */
			qtree_bitins(scratch,nqx,nqy,a,n,bit);
		}
	}
	free(scratch);
	return(0);
}